

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void prvTidyParseInline(TidyDocImpl *doc,Node *element,GetTokenMode mode)

{
  Lexer *pLVar1;
  Bool BVar2;
  int iVar3;
  Node *pNVar4;
  Dict *pDVar5;
  tmbstr ptVar6;
  Node *node_00;
  Node *dd;
  Node *child;
  Node *parent;
  Node *node;
  Lexer *lexer;
  Node *pNStack_18;
  GetTokenMode mode_local;
  Node *element_local;
  TidyDocImpl *doc_local;
  
  pLVar1 = doc->lexer;
  if ((element->tag->model & 1) == 0) {
    BVar2 = prvTidynodeHasCM(element,8);
    if (((BVar2 == no) &&
        (((element == (Node *)0x0 || (element->tag == (Dict *)0x0)) ||
         (element->tag->id != TidyTag_DT)))) ||
       (BVar2 = prvTidynodeHasCM(element,0x20000), BVar2 != no)) {
      BVar2 = prvTidynodeHasCM(element,0x10);
      if (BVar2 != no) {
        prvTidyPushInline(doc,element);
      }
    }
    else {
      prvTidyInlineDup(doc,(Node *)0x0);
    }
    if (((element == (Node *)0x0) || (element->tag == (Dict *)0x0)) ||
       (element->tag->id != TidyTag_NOBR)) {
      if (((element != (Node *)0x0) && (element->tag != (Dict *)0x0)) &&
         (element->tag->id == TidyTag_FONT)) {
        doc->badLayout = doc->badLayout | 8;
      }
    }
    else {
      doc->badLayout = doc->badLayout | 4;
    }
    pNStack_18 = element;
    lexer._4_4_ = mode;
    if (mode != Preformatted) {
      lexer._4_4_ = MixedContent;
    }
LAB_00147964:
    pNVar4 = prvTidyGetToken(doc,lexer._4_4_);
    if (pNVar4 != (Node *)0x0) {
      if ((pNVar4->tag == pNStack_18->tag) && (pNVar4->type == EndTag)) {
        if ((pNStack_18->tag->model & 0x10) != 0) {
          prvTidyPopInline(doc,pNVar4);
        }
        prvTidyFreeNode(doc,pNVar4);
        if ((lexer._4_4_ & Preformatted) == IgnoreWhitespace) {
          TrimSpaces(doc,pNStack_18);
        }
        if ((((pNStack_18 != (Node *)0x0) && (pNStack_18->tag != (Dict *)0x0)) &&
            (pNStack_18->tag->id == TidyTag_FONT)) &&
           (((pNStack_18->content != (Node *)0x0 && (pNStack_18->content == pNStack_18->last)) &&
            ((pNVar4 = pNStack_18->content, pNVar4 != (Node *)0x0 &&
             ((pNVar4->tag != (Dict *)0x0 && (pNVar4->tag->id == TidyTag_A)))))))) {
          pNVar4->parent = pNStack_18->parent;
          pNVar4->next = pNStack_18->next;
          pNVar4->prev = pNStack_18->prev;
          pNStack_18->next = (Node *)0x0;
          pNStack_18->prev = (Node *)0x0;
          pNStack_18->parent = pNVar4;
          pNStack_18->content = pNVar4->content;
          pNStack_18->last = pNVar4->last;
          pNVar4->content = pNStack_18;
          prvTidyFixNodeLinks(pNVar4);
          prvTidyFixNodeLinks(pNStack_18);
        }
        pNStack_18->closed = yes;
        TrimSpaces(doc,pNStack_18);
        return;
      }
      if ((((((((((pNVar4->type == StartTag) && (pNVar4->tag == pNStack_18->tag)) &&
                (BVar2 = prvTidyIsPushed(doc,pNVar4), BVar2 != no)) &&
               ((pNVar4->implicit == no && (pNStack_18->implicit == no)))) &&
              (pNVar4->tag != (Dict *)0x0)) && ((pNVar4->tag->model & 0x10) != 0)) &&
            (((pNVar4 == (Node *)0x0 || (pNVar4->tag == (Dict *)0x0)) ||
             (pNVar4->tag->id != TidyTag_A)))) &&
           ((((((pNVar4 == (Node *)0x0 || (pNVar4->tag == (Dict *)0x0)) ||
               (pNVar4->tag->id != TidyTag_FONT)) &&
              (((pNVar4 == (Node *)0x0 || (pNVar4->tag == (Dict *)0x0)) ||
               (pNVar4->tag->id != TidyTag_BIG)))) &&
             (((pNVar4 == (Node *)0x0 || (pNVar4->tag == (Dict *)0x0)) ||
              (pNVar4->tag->id != TidyTag_SMALL)))) &&
            (((pNVar4 == (Node *)0x0 || (pNVar4->tag == (Dict *)0x0)) ||
             (pNVar4->tag->id != TidyTag_SUB)))))) &&
          (((pNVar4 == (Node *)0x0 || (pNVar4->tag == (Dict *)0x0)) ||
           (pNVar4->tag->id != TidyTag_SUP)))) &&
         ((((pNVar4 == (Node *)0x0 || (pNVar4->tag == (Dict *)0x0)) ||
           (pNVar4->tag->id != TidyTag_Q)) &&
          ((((pNVar4 == (Node *)0x0 || (pNVar4->tag == (Dict *)0x0)) ||
            (pNVar4->tag->id != TidyTag_SPAN)) && ((int)(doc->config).value[9].v != 0)))))) {
        if ((((pNStack_18->content != (Node *)0x0) && (pNVar4->attributes == (AttVal *)0x0)) &&
            (BVar2 = prvTidynodeIsText(pNStack_18->last), BVar2 != no)) &&
           (BVar2 = prvTidyTextNodeEndWithSpace(doc->lexer,pNStack_18->last), BVar2 == no)) {
          prvTidyReport(doc,pNStack_18,pNVar4,0x232);
          pNVar4->type = EndTag;
          prvTidyUngetToken(doc);
          goto LAB_00147964;
        }
        if ((pNVar4->attributes == (AttVal *)0x0) || (pNStack_18->attributes == (AttVal *)0x0)) {
          prvTidyReport(doc,pNStack_18,pNVar4,0x264);
        }
      }
      else {
        BVar2 = prvTidyIsPushed(doc,pNVar4);
        if (((BVar2 != no) && (pNVar4->type == StartTag)) &&
           (((pNVar4 != (Node *)0x0 &&
             ((pNVar4->tag != (Dict *)0x0 && (pNVar4->tag->id == TidyTag_Q)))) &&
            (iVar3 = prvTidyHTMLVersion(doc), iVar3 != 0x20000)))) {
          prvTidyReport(doc,pNStack_18,pNVar4,0x265);
        }
      }
      BVar2 = prvTidynodeIsText(pNVar4);
      if (BVar2 == no) {
        BVar2 = InsertMisc(pNStack_18,pNVar4);
        if (BVar2 == no) {
          if (((pNVar4 != (Node *)0x0) && (pNVar4->tag != (Dict *)0x0)) &&
             (pNVar4->tag->id == TidyTag_HTML)) {
            BVar2 = prvTidynodeIsElement(pNVar4);
            if (BVar2 == no) {
              prvTidyUngetToken(doc);
              if ((lexer._4_4_ & Preformatted) != IgnoreWhitespace) {
                return;
              }
              TrimSpaces(doc,pNStack_18);
              return;
            }
            prvTidyReport(doc,pNStack_18,pNVar4,0x235);
            prvTidyFreeNode(doc,pNVar4);
            goto LAB_00147964;
          }
          if ((((pNVar4 != (Node *)0x0) && (pNVar4->tag != (Dict *)0x0)) &&
              ((pNVar4->tag->id == TidyTag_P && (pNVar4->type == StartTag)))) &&
             (((lexer._4_4_ & Preformatted) != IgnoreWhitespace ||
              ((((pNStack_18 != (Node *)0x0 && (pNStack_18->tag != (Dict *)0x0)) &&
                (pNStack_18->tag->id == TidyTag_DT)) ||
               (BVar2 = DescendantOf(pNStack_18,TidyTag_DT), BVar2 != no)))))) {
            pDVar5 = prvTidyLookupTagDef(TidyTag_BR);
            pNVar4->tag = pDVar5;
            (*doc->allocator->vtbl->free)(doc->allocator,pNVar4->element);
            ptVar6 = prvTidytmbstrdup(doc->allocator,"br");
            pNVar4->element = ptVar6;
            TrimSpaces(doc,pNStack_18);
            prvTidyInsertNodeAtEnd(pNStack_18,pNVar4);
            goto LAB_00147964;
          }
          if (((((pNVar4 != (Node *)0x0) && (pNVar4->tag != (Dict *)0x0)) &&
               (pNVar4->tag->id == TidyTag_P)) &&
              ((pNVar4->type == StartTag && (pNStack_18 != (Node *)0x0)))) &&
             ((pNStack_18->tag != (Dict *)0x0 && (pNStack_18->tag->id == TidyTag_ADDRESS)))) {
            prvTidyConstrainVersion(doc,0xfffffedb);
            prvTidyInsertNodeAtEnd(pNStack_18,pNVar4);
            (*pNVar4->tag->parser)(doc,pNVar4,lexer._4_4_);
            goto LAB_00147964;
          }
          if ((pNVar4->tag == (Dict *)0x0) ||
             (((pNVar4 != (Node *)0x0 && (pNVar4->tag != (Dict *)0x0)) &&
              (pNVar4->tag->id == TidyTag_PARAM)))) {
            prvTidyReport(doc,pNStack_18,pNVar4,0x235);
            prvTidyFreeNode(doc,pNVar4);
            goto LAB_00147964;
          }
          if ((((pNVar4 != (Node *)0x0) && (pNVar4->tag != (Dict *)0x0)) &&
              (pNVar4->tag->id == TidyTag_BR)) && (pNVar4->type == EndTag)) {
            pNVar4->type = StartTag;
          }
          if (pNVar4->type == EndTag) {
            if (((pNVar4 == (Node *)0x0) || (pNVar4->tag == (Dict *)0x0)) ||
               (pNVar4->tag->id != TidyTag_BR)) {
              if (((pNVar4 == (Node *)0x0) || (pNVar4->tag == (Dict *)0x0)) ||
                 (pNVar4->tag->id != TidyTag_P)) {
                BVar2 = prvTidynodeHasCM(pNVar4,0x10);
                if (((BVar2 != no) &&
                    (((pNVar4 == (Node *)0x0 || (pNVar4->tag == (Dict *)0x0)) ||
                     (pNVar4->tag->id != TidyTag_A)))) &&
                   ((BVar2 = prvTidynodeHasCM(pNVar4,0x800), BVar2 == no &&
                    (BVar2 = prvTidynodeHasCM(pNStack_18,0x10), BVar2 != no)))) {
                  if (((pNStack_18 == (Node *)0x0) ||
                      ((pNStack_18->tag == (Dict *)0x0 || (pNStack_18->tag->id != TidyTag_A)))) &&
                     ((pNVar4->tag != pNStack_18->tag &&
                      (((BVar2 = prvTidyIsPushed(doc,pNVar4), BVar2 != no &&
                        (BVar2 = prvTidyIsPushed(doc,pNStack_18), BVar2 != no)) &&
                       (BVar2 = prvTidySwitchInline(doc,pNStack_18,pNVar4), BVar2 != no)))))) {
                    prvTidyReport(doc,pNStack_18,pNVar4,0x268);
                    prvTidyUngetToken(doc);
                    prvTidyInlineDup1(doc,(Node *)0x0,pNStack_18);
                    if ((lexer._4_4_ & Preformatted) != IgnoreWhitespace) {
                      return;
                    }
                    TrimSpaces(doc,pNStack_18);
                    return;
                  }
                  prvTidyPopInline(doc,pNStack_18);
                  if (((pNStack_18 == (Node *)0x0) || (pNStack_18->tag == (Dict *)0x0)) ||
                     (pNStack_18->tag->id != TidyTag_A)) {
                    if (((pNVar4 == (Node *)0x0) || (pNVar4->tag == (Dict *)0x0)) ||
                       ((pNVar4->tag->id != TidyTag_A || (pNVar4->tag == pNStack_18->tag)))) {
                      prvTidyReport(doc,pNStack_18,pNVar4,0x268);
                      prvTidyFreeNode(doc,pNVar4);
                    }
                    else {
                      prvTidyReport(doc,pNStack_18,pNVar4,0x259);
                      prvTidyUngetToken(doc);
                    }
                    if ((lexer._4_4_ & Preformatted) != IgnoreWhitespace) {
                      return;
                    }
                    TrimSpaces(doc,pNStack_18);
                    return;
                  }
                  prvTidyReport(doc,pNStack_18,pNVar4,0x235);
                  prvTidyFreeNode(doc,pNVar4);
                  goto LAB_00147964;
                }
                if ((pLVar1->exiled != no) &&
                   ((BVar2 = prvTidynodeHasCM(pNVar4,0x80), BVar2 != no ||
                    (((pNVar4 != (Node *)0x0 && (pNVar4->tag != (Dict *)0x0)) &&
                     (pNVar4->tag->id == TidyTag_TABLE)))))) {
                  prvTidyUngetToken(doc);
                  TrimSpaces(doc,pNStack_18);
                  return;
                }
              }
              else {
                BVar2 = DescendantOf(pNStack_18,TidyTag_P);
                if (BVar2 == no) {
                  prvTidyCoerceNode(doc,pNVar4,TidyTag_BR,no,no);
                  TrimSpaces(doc,pNStack_18);
                  prvTidyInsertNodeAtEnd(pNStack_18,pNVar4);
                  pNVar4 = prvTidyInferredTag(doc,TidyTag_BR);
                  prvTidyInsertNodeAtEnd(pNStack_18,pNVar4);
                  goto LAB_00147964;
                }
              }
            }
            else {
              pNVar4->type = StartTag;
            }
          }
          BVar2 = prvTidynodeHasCM(pNVar4,0x4000);
          if ((BVar2 != no) && (BVar2 = prvTidynodeHasCM(pNStack_18,0x4000), BVar2 != no)) {
            if (pNVar4->tag == pNStack_18->tag) {
              prvTidyReport(doc,pNStack_18,pNVar4,0x268);
              prvTidyFreeNode(doc,pNVar4);
            }
            else {
              prvTidyReport(doc,pNStack_18,pNVar4,0x259);
              prvTidyUngetToken(doc);
            }
            if ((lexer._4_4_ & Preformatted) != IgnoreWhitespace) {
              return;
            }
            TrimSpaces(doc,pNStack_18);
            return;
          }
          if ((((pNVar4 != (Node *)0x0) && (pNVar4->tag != (Dict *)0x0)) &&
              ((pNVar4->tag->id == TidyTag_A && (pNVar4->implicit == no)))) &&
             ((((pNStack_18 != (Node *)0x0 && (pNStack_18->tag != (Dict *)0x0)) &&
               (pNStack_18->tag->id == TidyTag_A)) ||
              (BVar2 = DescendantOf(pNStack_18,TidyTag_A), BVar2 != no)))) {
            if (((pNVar4->type == EndTag) || (pNVar4->attributes != (AttVal *)0x0)) ||
               ((int)(doc->config).value[9].v == 0)) {
              prvTidyUngetToken(doc);
              prvTidyReport(doc,pNStack_18,pNVar4,0x259);
              if ((lexer._4_4_ & Preformatted) != IgnoreWhitespace) {
                return;
              }
              TrimSpaces(doc,pNStack_18);
              return;
            }
            pNVar4->type = EndTag;
            prvTidyReport(doc,pNStack_18,pNVar4,0x232);
            prvTidyUngetToken(doc);
            goto LAB_00147964;
          }
          if ((pNStack_18->tag->model & 0x4000) != 0) {
            if ((((pNVar4 != (Node *)0x0) && (pNVar4->tag != (Dict *)0x0)) &&
                (pNVar4->tag->id == TidyTag_CENTER)) ||
               (((pNVar4 != (Node *)0x0 && (pNVar4->tag != (Dict *)0x0)) &&
                (pNVar4->tag->id == TidyTag_DIV)))) {
              BVar2 = prvTidynodeIsElement(pNVar4);
              if (BVar2 == no) {
                prvTidyReport(doc,pNStack_18,pNVar4,0x235);
                prvTidyFreeNode(doc,pNVar4);
              }
              else {
                prvTidyReport(doc,pNStack_18,pNVar4,0x27e);
                if (pNStack_18->content == (Node *)0x0) {
                  InsertNodeAsParent(pNStack_18,pNVar4);
                }
                else {
                  prvTidyInsertNodeAfterElement(pNStack_18,pNVar4);
                  if ((lexer._4_4_ & Preformatted) == IgnoreWhitespace) {
                    TrimSpaces(doc,pNStack_18);
                  }
                  pNStack_18 = prvTidyCloneNode(doc,pNStack_18);
                  prvTidyInsertNodeAtEnd(pNVar4,pNStack_18);
                }
              }
              goto LAB_00147964;
            }
            if (((pNVar4 != (Node *)0x0) && (pNVar4->tag != (Dict *)0x0)) &&
               (pNVar4->tag->id == TidyTag_HR)) {
              BVar2 = prvTidynodeIsElement(pNVar4);
              if (BVar2 == no) {
                prvTidyReport(doc,pNStack_18,pNVar4,0x235);
                prvTidyFreeNode(doc,pNVar4);
              }
              else {
                prvTidyReport(doc,pNStack_18,pNVar4,0x27e);
                if (pNStack_18->content == (Node *)0x0) {
                  prvTidyInsertNodeBeforeElement(pNStack_18,pNVar4);
                }
                else {
                  prvTidyInsertNodeAfterElement(pNStack_18,pNVar4);
                  if ((lexer._4_4_ & Preformatted) == IgnoreWhitespace) {
                    TrimSpaces(doc,pNStack_18);
                  }
                  pNStack_18 = prvTidyCloneNode(doc,pNStack_18);
                  prvTidyInsertNodeAfterElement(pNVar4,pNStack_18);
                }
              }
              goto LAB_00147964;
            }
          }
          if (((pNStack_18 == (Node *)0x0) || (pNStack_18->tag == (Dict *)0x0)) ||
             (((pNStack_18->tag->id != TidyTag_DT ||
               ((pNVar4 == (Node *)0x0 || (pNVar4->tag == (Dict *)0x0)))) ||
              (pNVar4->tag->id != TidyTag_HR)))) {
            if (pNVar4->type == EndTag) {
              for (child = pNStack_18->parent; child != (Node *)0x0; child = child->parent) {
                if (pNVar4->tag == child->tag) {
                  if (((pNStack_18->tag->model & 0x8000) == 0) && (pNStack_18->implicit == no)) {
                    prvTidyReport(doc,pNStack_18,pNVar4,0x259);
                  }
                  BVar2 = prvTidyIsPushedLast(doc,pNStack_18,pNVar4);
                  if (BVar2 != no) {
                    prvTidyPopInline(doc,pNStack_18);
                  }
                  prvTidyUngetToken(doc);
                  if ((lexer._4_4_ & Preformatted) != IgnoreWhitespace) {
                    return;
                  }
                  TrimSpaces(doc,pNStack_18);
                  return;
                }
              }
            }
            if ((((pNVar4->tag->model & 0x10) == 0) && ((pNStack_18->tag->model & 0x20000) == 0)) &&
               (((pNStack_18 == (Node *)0x0 ||
                 (((pNStack_18->tag == (Dict *)0x0 || (pNStack_18->tag->id != TidyTag_SPAN)) ||
                  (pNVar4 == (Node *)0x0)))) ||
                ((pNVar4->tag == (Dict *)0x0 || (pNVar4->tag->id != TidyTag_META)))))) {
              BVar2 = prvTidynodeIsElement(pNVar4);
              if (BVar2 == no) {
                prvTidyReport(doc,pNStack_18,pNVar4,0x235);
                prvTidyFreeNode(doc,pNVar4);
              }
              else {
                if (((pNStack_18 == (Node *)0x0) || (pNStack_18->tag == (Dict *)0x0)) ||
                   (pNStack_18->tag->id != TidyTag_DATALIST)) {
                  if ((pNStack_18->tag->model & 0x8000) == 0) {
                    prvTidyReport(doc,pNStack_18,pNVar4,0x259);
                  }
                }
                else {
                  prvTidyConstrainVersion(doc,0xfff9ffff);
                }
                if (((pNVar4->tag->model & 4) == 0) || ((pNVar4->tag->model & 8) != 0)) {
                  if ((pNStack_18 != (Node *)0x0) &&
                     ((pNStack_18->tag != (Dict *)0x0 && (pNStack_18->tag->id == TidyTag_A)))) {
                    if ((pNVar4->tag == (Dict *)0x0) || ((pNVar4->tag->model & 0x4000) != 0)) {
                      if (pNStack_18->content == (Node *)0x0) {
                        prvTidyDiscardElement(doc,pNStack_18);
                        prvTidyUngetToken(doc);
                        return;
                      }
                    }
                    else {
                      prvTidyPopInline(doc,pNStack_18);
                    }
                  }
                  prvTidyUngetToken(doc);
                  if ((lexer._4_4_ & Preformatted) != IgnoreWhitespace) {
                    return;
                  }
                  TrimSpaces(doc,pNStack_18);
                  return;
                }
                MoveToHead(doc,pNStack_18,pNVar4);
              }
            }
            else {
              BVar2 = prvTidynodeIsElement(pNVar4);
              if (BVar2 == no) {
                prvTidyReport(doc,pNStack_18,pNVar4,0x235);
                prvTidyFreeNode(doc,pNVar4);
              }
              else {
                if (pNVar4->implicit != no) {
                  prvTidyReport(doc,pNStack_18,pNVar4,0x247);
                }
                if (((pNVar4 != (Node *)0x0) && (pNVar4->tag != (Dict *)0x0)) &&
                   (pNVar4->tag->id == TidyTag_BR)) {
                  TrimSpaces(doc,pNStack_18);
                }
                prvTidyInsertNodeAtEnd(pNStack_18,pNVar4);
                ParseTag(doc,pNVar4,lexer._4_4_);
              }
            }
          }
          else {
            BVar2 = prvTidynodeIsElement(pNVar4);
            if (BVar2 == no) {
              prvTidyReport(doc,pNStack_18,pNVar4,0x235);
              prvTidyFreeNode(doc,pNVar4);
            }
            else {
              prvTidyReport(doc,pNStack_18,pNVar4,0x27e);
              node_00 = prvTidyInferredTag(doc,TidyTag_DD);
              if (pNStack_18->content == (Node *)0x0) {
                prvTidyInsertNodeBeforeElement(pNStack_18,node_00);
                prvTidyInsertNodeAtEnd(node_00,pNVar4);
              }
              else {
                prvTidyInsertNodeAfterElement(pNStack_18,node_00);
                prvTidyInsertNodeAtEnd(node_00,pNVar4);
                if ((lexer._4_4_ & Preformatted) == IgnoreWhitespace) {
                  TrimSpaces(doc,pNStack_18);
                }
                pNStack_18 = prvTidyCloneNode(doc,pNStack_18);
                prvTidyInsertNodeAfterElement(node_00,pNStack_18);
              }
            }
          }
        }
      }
      else {
        if ((pNStack_18->content == (Node *)0x0) &&
           ((lexer._4_4_ & Preformatted) == IgnoreWhitespace)) {
          TrimSpaces(doc,pNStack_18);
        }
        if (pNVar4->start < pNVar4->end) {
          prvTidyInsertNodeAtEnd(pNStack_18,pNVar4);
        }
        else {
          prvTidyFreeNode(doc,pNVar4);
        }
      }
      goto LAB_00147964;
    }
    if ((pNStack_18->tag->model & 0x8000) == 0) {
      prvTidyReport(doc,pNStack_18,(Node *)0x0,0x25a);
    }
  }
  return;
}

Assistant:

void TY_(ParseInline)( TidyDocImpl* doc, Node *element, GetTokenMode mode )
{
#if defined(ENABLE_DEBUG_LOG)
    static int in_parse_inline = 0;
#endif
    Lexer* lexer = doc->lexer;
    Node *node, *parent;
#if defined(ENABLE_DEBUG_LOG)
    in_parse_inline++;
    SPRTF("Entering ParseInline %d...\n",in_parse_inline);
#endif

    if (element->tag->model & CM_EMPTY) {
#if defined(ENABLE_DEBUG_LOG)
        in_parse_inline--;
        SPRTF("Exit ParseInline 1 %d...\n",in_parse_inline);
#endif
        return;
    }

    /*
     ParseInline is used for some block level elements like H1 to H6
     For such elements we need to insert inline emphasis tags currently
     on the inline stack. For Inline elements, we normally push them
     onto the inline stack provided they aren't implicit or OBJECT/APPLET.
     This test is carried out in PushInline and PopInline, see istack.c

     InlineDup(...) is not called for elements with a CM_MIXED (inline and
     block) content model, e.g. <del> or <ins>, otherwise constructs like 

       <p>111<a name='foo'>222<del>333</del>444</a>555</p>
       <p>111<span>222<del>333</del>444</span>555</p>
       <p>111<em>222<del>333</del>444</em>555</p>

     will get corrupted.
    */
    if ((TY_(nodeHasCM)(element, CM_BLOCK) || nodeIsDT(element)) &&
        !TY_(nodeHasCM)(element, CM_MIXED))
        TY_(InlineDup)(doc, NULL);
    else if (TY_(nodeHasCM)(element, CM_INLINE))
        TY_(PushInline)(doc, element);

    if ( nodeIsNOBR(element) )
        doc->badLayout |= USING_NOBR;
    else if ( nodeIsFONT(element) )
        doc->badLayout |= USING_FONT;

    /* Inline elements may or may not be within a preformatted element */
    if (mode != Preformatted)
        mode = MixedContent;

    while ((node = TY_(GetToken)(doc, mode)) != NULL)
    {
        /* end tag for current element */
        if (node->tag == element->tag && node->type == EndTag)
        {
            if (element->tag->model & CM_INLINE)
                TY_(PopInline)( doc, node );

            TY_(FreeNode)( doc, node );

            if (!(mode & Preformatted))
                TrimSpaces(doc, element);

            /*
             if a font element wraps an anchor and nothing else
             then move the font element inside the anchor since
             otherwise it won't alter the anchor text color
            */
            if ( nodeIsFONT(element) && 
                 element->content && element->content == element->last )
            {
                Node *child = element->content;

                if ( nodeIsA(child) )
                {
                    child->parent = element->parent;
                    child->next = element->next;
                    child->prev = element->prev;

                    element->next = NULL;
                    element->prev = NULL;
                    element->parent = child;

                    element->content = child->content;
                    element->last = child->last;
                    child->content = element;

                    TY_(FixNodeLinks)(child);
                    TY_(FixNodeLinks)(element);
                }
            }

            element->closed = yes;
            TrimSpaces( doc, element );
#if defined(ENABLE_DEBUG_LOG)
            in_parse_inline--;
            SPRTF("Exit ParseInline 2 %d...\n",in_parse_inline);
#endif
            return;
        }

        /* <u>...<u>  map 2nd <u> to </u> if 1st is explicit */
        /* (see additional conditions below) */
        /* otherwise emphasis nesting is probably unintentional */
        /* big, small, sub, sup have cumulative effect to leave them alone */
        if ( node->type == StartTag
             && node->tag == element->tag
             && TY_(IsPushed)( doc, node )
             && !node->implicit
             && !element->implicit
             && node->tag && (node->tag->model & CM_INLINE)
             && !nodeIsA(node)
             && !nodeIsFONT(node)
             && !nodeIsBIG(node)
             && !nodeIsSMALL(node)
             && !nodeIsSUB(node)
             && !nodeIsSUP(node)
             && !nodeIsQ(node)
             && !nodeIsSPAN(node)
             && cfgBool(doc, TidyCoerceEndTags)
           )
        {
            /* proceeds only if "node" does not have any attribute and
               follows a text node not finishing with a space */
            if (element->content != NULL && node->attributes == NULL
                && TY_(nodeIsText)(element->last)
                && !TY_(TextNodeEndWithSpace)(doc->lexer, element->last) )
            {
                TY_(Report)(doc, element, node, COERCE_TO_ENDTAG);
                node->type = EndTag;
                TY_(UngetToken)(doc);
                continue;
            }

            if (node->attributes == NULL || element->attributes == NULL)
                TY_(Report)(doc, element, node, NESTED_EMPHASIS);
        }
        else if ( TY_(IsPushed)(doc, node) && node->type == StartTag && 
                  nodeIsQ(node) )
        {
            /*\
             * Issue #215 - such nested quotes are NOT a problem if HTML5, so
             * only issue this warning if NOT HTML5 mode.
            \*/
            if (TY_(HTMLVersion)(doc) != HT50) 
            {
                TY_(Report)(doc, element, node, NESTED_QUOTATION);
            }
        }

        if ( TY_(nodeIsText)(node) )
        {
            /* only called for 1st child */
            if ( element->content == NULL && !(mode & Preformatted) )
                TrimSpaces( doc, element );

            if ( node->start >= node->end )
            {
                TY_(FreeNode)( doc, node );
                continue;
            }

            TY_(InsertNodeAtEnd)(element, node);
            continue;
        }

        /* mixed content model so allow text */
        if (InsertMisc(element, node))
            continue;

        /* deal with HTML tags */
        if ( nodeIsHTML(node) )
        {
            if ( TY_(nodeIsElement)(node) )
            {
                TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED );
                TY_(FreeNode)( doc, node );
                continue;
            }

            /* otherwise infer end of inline element */
            TY_(UngetToken)( doc );

            if (!(mode & Preformatted))
                TrimSpaces(doc, element);
#if defined(ENABLE_DEBUG_LOG)
            in_parse_inline--;
            SPRTF("Exit ParseInline 3 %d...\n",in_parse_inline);
#endif
            return;
        }

        /* within <dt> or <pre> map <p> to <br> */
        if ( nodeIsP(node) &&
             node->type == StartTag &&
             ( (mode & Preformatted) ||
               nodeIsDT(element) || 
               DescendantOf(element, TidyTag_DT )
             )
           )
        {
            node->tag = TY_(LookupTagDef)( TidyTag_BR );
            TidyDocFree(doc, node->element);
            node->element = TY_(tmbstrdup)(doc->allocator, "br");
            TrimSpaces(doc, element);
            TY_(InsertNodeAtEnd)(element, node);
            continue;
        }

        /* <p> allowed within <address> in HTML 4.01 Transitional */
        if ( nodeIsP(node) &&
             node->type == StartTag &&
             nodeIsADDRESS(element) )
        {
            TY_(ConstrainVersion)( doc, ~VERS_HTML40_STRICT );
            TY_(InsertNodeAtEnd)(element, node);
            (*node->tag->parser)( doc, node, mode );
            continue;
        }

        /* ignore unknown and PARAM tags */
        if ( node->tag == NULL || nodeIsPARAM(node) )
        {
            TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node );
            continue;
        }

        if ( nodeIsBR(node) && node->type == EndTag )
            node->type = StartTag;

        if ( node->type == EndTag )
        {
           /* coerce </br> to <br> */
           if ( nodeIsBR(node) )
                node->type = StartTag;
           else if ( nodeIsP(node) )
           {
               /* coerce unmatched </p> to <br><br> */
                if ( !DescendantOf(element, TidyTag_P) )
                {
                    TY_(CoerceNode)(doc, node, TidyTag_BR, no, no);
                    TrimSpaces( doc, element );
                    TY_(InsertNodeAtEnd)( element, node );
                    node = TY_(InferredTag)(doc, TidyTag_BR);
                    TY_(InsertNodeAtEnd)( element, node ); /* todo: check this */
                    continue;
                }
           }
           else if ( TY_(nodeHasCM)(node, CM_INLINE)
                     && !nodeIsA(node)
                     && !TY_(nodeHasCM)(node, CM_OBJECT)
                     && TY_(nodeHasCM)(element, CM_INLINE) )
            {
                /* allow any inline end tag to end current element */

                /* http://tidy.sf.net/issue/1426419 */
                /* but, like the browser, retain an earlier inline element.
                   This is implemented by setting the lexer into a mode
                   where it gets tokens from the inline stack rather than
                   from the input stream. Check if the scenerio fits. */
                if ( !nodeIsA(element)
                     && (node->tag != element->tag)
                     && TY_(IsPushed)( doc, node )
                     && TY_(IsPushed)( doc, element ) )
                {
                    /* we have something like
                       <b>bold <i>bold and italic</b> italics</i> */
                    if ( TY_(SwitchInline)( doc, element, node ) )
                    {
                        TY_(Report)(doc, element, node, NON_MATCHING_ENDTAG);
                        TY_(UngetToken)( doc ); /* put this back */
                        TY_(InlineDup1)( doc, NULL, element ); /* dupe the <i>, after </b> */
                        if (!(mode & Preformatted))
                            TrimSpaces( doc, element );
#if defined(ENABLE_DEBUG_LOG)
                        in_parse_inline--;
                        SPRTF("Exit ParseInline 4 %d...\n",in_parse_inline);
#endif
                        return; /* close <i>, but will re-open it, after </b> */
                    }
                }
                TY_(PopInline)( doc, element );

                if ( !nodeIsA(element) )
                {
                    if ( nodeIsA(node) && node->tag != element->tag )
                    {
                       TY_(Report)(doc, element, node, MISSING_ENDTAG_BEFORE );
                       TY_(UngetToken)( doc );
                    }
                    else
                    {
                        TY_(Report)(doc, element, node, NON_MATCHING_ENDTAG);
                        TY_(FreeNode)( doc, node);
                    }

                    if (!(mode & Preformatted))
                        TrimSpaces(doc, element);
#if defined(ENABLE_DEBUG_LOG)
                    in_parse_inline--;
                    SPRTF("Exit ParseInline 5 %d...\n",in_parse_inline);
#endif
                    return;
                }

                /* if parent is <a> then discard unexpected inline end tag */
                TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }  /* special case </tr> etc. for stuff moved in front of table */
            else if ( lexer->exiled
                     && (TY_(nodeHasCM)(node, CM_TABLE) || nodeIsTABLE(node)) )
            {
                TY_(UngetToken)( doc );
                TrimSpaces(doc, element);
#if defined(ENABLE_DEBUG_LOG)
                in_parse_inline--;
                SPRTF("Exit ParseInline 6 %d...\n",in_parse_inline);
#endif
                return;
            }
        }

        /* allow any header tag to end current header */
        if ( TY_(nodeHasCM)(node, CM_HEADING) && TY_(nodeHasCM)(element, CM_HEADING) )
        {

            if ( node->tag == element->tag )
            {
                TY_(Report)(doc, element, node, NON_MATCHING_ENDTAG );
                TY_(FreeNode)( doc, node);
            }
            else
            {
                TY_(Report)(doc, element, node, MISSING_ENDTAG_BEFORE );
                TY_(UngetToken)( doc );
            }

            if (!(mode & Preformatted))
                TrimSpaces(doc, element);

#if defined(ENABLE_DEBUG_LOG)
            in_parse_inline--;
            SPRTF("Exit ParseInline 7 %d...\n",in_parse_inline);
#endif
            return;
        }

        /*
           an <A> tag to ends any open <A> element
           but <A href=...> is mapped to </A><A href=...>
        */
        /* #427827 - fix by Randy Waki and Bjoern Hoehrmann 23 Aug 00 */
        /* if (node->tag == doc->tags.tag_a && !node->implicit && TY_(IsPushed)(doc, node)) */
        if ( nodeIsA(node) && !node->implicit && 
             (nodeIsA(element) || DescendantOf(element, TidyTag_A)) )
        {
            /* coerce <a> to </a> unless it has some attributes */
            /* #427827 - fix by Randy Waki and Bjoern Hoehrmann 23 Aug 00 */
            /* other fixes by Dave Raggett */
            /* if (node->attributes == NULL) */
            if (node->type != EndTag && node->attributes == NULL
                && cfgBool(doc, TidyCoerceEndTags) )
            {
                node->type = EndTag;
                TY_(Report)(doc, element, node, COERCE_TO_ENDTAG);
                /* TY_(PopInline)( doc, node ); */
                TY_(UngetToken)( doc );
                continue;
            }

            TY_(UngetToken)( doc );
            TY_(Report)(doc, element, node, MISSING_ENDTAG_BEFORE);
            /* TY_(PopInline)( doc, element ); */

            if (!(mode & Preformatted))
                TrimSpaces(doc, element);

#if defined(ENABLE_DEBUG_LOG)
            in_parse_inline--;
            SPRTF("Exit ParseInline 8 %d...\n",in_parse_inline);
#endif
            return;
        }

        if (element->tag->model & CM_HEADING)
        {
            if ( nodeIsCENTER(node) || nodeIsDIV(node) )
            {
                if (!TY_(nodeIsElement)(node))
                {
                    TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                TY_(Report)(doc, element, node, TAG_NOT_ALLOWED_IN);

                /* insert center as parent if heading is empty */
                if (element->content == NULL)
                {
                    InsertNodeAsParent(element, node);
                    continue;
                }

                /* split heading and make center parent of 2nd part */
                TY_(InsertNodeAfterElement)(element, node);

                if (!(mode & Preformatted))
                    TrimSpaces(doc, element);

                element = TY_(CloneNode)( doc, element );
                TY_(InsertNodeAtEnd)(node, element);
                continue;
            }

            if ( nodeIsHR(node) )
            {
                if ( !TY_(nodeIsElement)(node) )
                {
                    TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                TY_(Report)(doc, element, node, TAG_NOT_ALLOWED_IN);

                /* insert hr before heading if heading is empty */
                if (element->content == NULL)
                {
                    TY_(InsertNodeBeforeElement)(element, node);
                    continue;
                }

                /* split heading and insert hr before 2nd part */
                TY_(InsertNodeAfterElement)(element, node);

                if (!(mode & Preformatted))
                    TrimSpaces(doc, element);

                element = TY_(CloneNode)( doc, element );
                TY_(InsertNodeAfterElement)(node, element);
                continue;
            }
        }

        if ( nodeIsDT(element) )
        {
            if ( nodeIsHR(node) )
            {
                Node *dd;
                if ( !TY_(nodeIsElement)(node) )
                {
                    TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                TY_(Report)(doc, element, node, TAG_NOT_ALLOWED_IN);
                dd = TY_(InferredTag)(doc, TidyTag_DD);

                /* insert hr within dd before dt if dt is empty */
                if (element->content == NULL)
                {
                    TY_(InsertNodeBeforeElement)(element, dd);
                    TY_(InsertNodeAtEnd)(dd, node);
                    continue;
                }

                /* split dt and insert hr within dd before 2nd part */
                TY_(InsertNodeAfterElement)(element, dd);
                TY_(InsertNodeAtEnd)(dd, node);

                if (!(mode & Preformatted))
                    TrimSpaces(doc, element);

                element = TY_(CloneNode)( doc, element );
                TY_(InsertNodeAfterElement)(dd, element);
                continue;
            }
        }


        /* 
          if this is the end tag for an ancestor element
          then infer end tag for this element
        */
        if (node->type == EndTag)
        {
            for (parent = element->parent;
                    parent != NULL; parent = parent->parent)
            {
                if (node->tag == parent->tag)
                {
                    if (!(element->tag->model & CM_OPT) && !element->implicit)
                        TY_(Report)(doc, element, node, MISSING_ENDTAG_BEFORE);

                    if( TY_(IsPushedLast)( doc, element, node ) ) 
                        TY_(PopInline)( doc, element );
                    TY_(UngetToken)( doc );

                    if (!(mode & Preformatted))
                        TrimSpaces(doc, element);

#if defined(ENABLE_DEBUG_LOG)
                    in_parse_inline--;
                    SPRTF("Exit ParseInline 9 %d...\n",in_parse_inline);
#endif
                    return;
                }
            }
        }

        /*\
         *  block level tags end this element 
         *  Issue #333 - There seems an exception if the element is a 'span',
         *  and the node just collected is a 'meta'. The 'meta' can not have
         *  CM_INLINE added, nor can the 'span' have CM_MIXED added without
         *  big consequences.
         *  There may be other exceptions to be added...
        \*/
        if (!(node->tag->model & CM_INLINE) &&
            !(element->tag->model & CM_MIXED) &&
            !(nodeIsSPAN(element) && nodeIsMETA(node)) )
        {
            if ( !TY_(nodeIsElement)(node) )
            {
                TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }
            /* HTML5 */
            if (nodeIsDATALIST(element)) {
                TY_(ConstrainVersion)( doc, ~VERS_HTML5 );
            } else
            if (!(element->tag->model & CM_OPT))
                TY_(Report)(doc, element, node, MISSING_ENDTAG_BEFORE);

            if (node->tag->model & CM_HEAD && !(node->tag->model & CM_BLOCK))
            {
                MoveToHead(doc, element, node);
                continue;
            }

            /*
               prevent anchors from propagating into block tags
               except for headings h1 to h6
            */
            if ( nodeIsA(element) )
            {
                if (node->tag && !(node->tag->model & CM_HEADING))
                    TY_(PopInline)( doc, element );
                else if (!(element->content))
                {
                    TY_(DiscardElement)( doc, element );
                    TY_(UngetToken)( doc );
#if defined(ENABLE_DEBUG_LOG)
                    in_parse_inline--;
                    SPRTF("Exit ParseInline 10 %d...\n",in_parse_inline);
#endif
                    return;
                }
            }

            TY_(UngetToken)( doc );

            if (!(mode & Preformatted))
                TrimSpaces(doc, element);

#if defined(ENABLE_DEBUG_LOG)
            in_parse_inline--;
            SPRTF("Exit ParseInline 11 %d...\n",in_parse_inline);
#endif
            return;
        }

        /* parse inline element */
        if (TY_(nodeIsElement)(node))
        {
            if (node->implicit)
                TY_(Report)(doc, element, node, INSERTING_TAG);

            /* trim white space before <br> */
            if ( nodeIsBR(node) )
                TrimSpaces(doc, element);
            
            TY_(InsertNodeAtEnd)(element, node);
            ParseTag(doc, node, mode);
            continue;
        }

        /* discard unexpected tags */
        TY_(Report)(doc, element, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node );
        continue;
    }

    if (!(element->tag->model & CM_OPT))
        TY_(Report)(doc, element, node, MISSING_ENDTAG_FOR);

#if defined(ENABLE_DEBUG_LOG)
    in_parse_inline--;
    SPRTF("Exit ParseInline 12 %d...\n",in_parse_inline);
#endif
}